

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O2

void __thiscall
kj::Canceler::AdapterImpl<unsigned_int>::cancel(AdapterImpl<unsigned_int> *this,Exception *e)

{
  Own<kj::_::PromiseNode> local_18;
  
  (*this->fulfiller->_vptr_PromiseFulfiller[1])();
  local_18.disposer = (Disposer *)0x0;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&this->inner,&local_18);
  Own<kj::_::PromiseNode>::dispose(&local_18);
  return;
}

Assistant:

void cancel(Exception&& e) override {
      fulfiller.reject(kj::mv(e));
      inner = nullptr;
    }